

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O1

ze_result_t
loader::zeCommandListGetNextCommandIdWithKernelsExp
          (ze_command_list_handle_t hCommandList,ze_mutable_command_id_exp_desc_t *desc,
          uint32_t numKernels,ze_kernel_handle_t *phKernels,uint64_t *pCommandId)

{
  code *pcVar1;
  undefined8 uVar2;
  ze_result_t zVar3;
  void *pvVar4;
  ulong uVar5;
  bool bVar6;
  
  pcVar1 = *(code **)(*(long *)(hCommandList + 8) + 0x360);
  if (pcVar1 == (code *)0x0) {
    zVar3 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    uVar2 = *(undefined8 *)hCommandList;
    pvVar4 = operator_new__((ulong)numKernels * 8);
    if (numKernels != 0 && phKernels != (ze_kernel_handle_t *)0x0) {
      uVar5 = 1;
      do {
        *(undefined8 *)((long)pvVar4 + uVar5 * 8 + -8) = *(undefined8 *)phKernels[uVar5 - 1];
        if (phKernels == (ze_kernel_handle_t *)0x0) break;
        bVar6 = uVar5 < numKernels;
        uVar5 = uVar5 + 1;
      } while (bVar6);
    }
    zVar3 = (*pcVar1)(uVar2,desc,numKernels,pvVar4,pCommandId);
    operator_delete__(pvVar4);
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListGetNextCommandIdWithKernelsExp(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        const ze_mutable_command_id_exp_desc_t* desc,   ///< [in][out] pointer to mutable command identifier descriptor
        uint32_t numKernels,                            ///< [in][optional] number of entries on phKernels list
        ze_kernel_handle_t* phKernels,                  ///< [in][optional][range(0, numKernels)] list of kernels that user can
                                                        ///< switch between using ::zeCommandListUpdateMutableCommandKernelsExp
                                                        ///< call
        uint64_t* pCommandId                            ///< [out] pointer to mutable command identifier to be written
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnGetNextCommandIdWithKernelsExp = dditable->ze.CommandListExp.pfnGetNextCommandIdWithKernelsExp;
        if( nullptr == pfnGetNextCommandIdWithKernelsExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // convert loader handles to driver handles
        auto phKernelsLocal = new ze_kernel_handle_t [numKernels];
        for( size_t i = 0; ( nullptr != phKernels ) && ( i < numKernels ); ++i )
            phKernelsLocal[ i ] = reinterpret_cast<ze_kernel_object_t*>( phKernels[ i ] )->handle;

        // forward to device-driver
        result = pfnGetNextCommandIdWithKernelsExp( hCommandList, desc, numKernels, phKernelsLocal, pCommandId );
        delete []phKernelsLocal;

        return result;
    }